

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O2

int cbs_open_async(CBS_HANDLE cbs,ON_CBS_OPEN_COMPLETE on_cbs_open_complete,
                  void *on_cbs_open_complete_context,ON_CBS_ERROR on_cbs_error,
                  void *on_cbs_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if ((on_cbs_open_complete == (ON_CBS_OPEN_COMPLETE)0x0 || cbs == (CBS_HANDLE)0x0) ||
      on_cbs_error == (ON_CBS_ERROR)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x187;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_open_async",0x186,1,
                "Bad arguments: cbs = %p, on_cbs_open_complete = %p, on_cbs_error = %p",cbs,
                on_cbs_open_complete,on_cbs_error);
    }
  }
  else if (cbs->cbs_state == CBS_STATE_CLOSED) {
    cbs->cbs_state = CBS_STATE_OPENING;
    cbs->on_cbs_open_complete = on_cbs_open_complete;
    cbs->on_cbs_open_complete_context = on_cbs_open_complete_context;
    cbs->on_cbs_error = on_cbs_error;
    cbs->on_cbs_error_context = on_cbs_error_context;
    iVar1 = amqp_management_open_async
                      (cbs->amqp_management,on_underlying_amqp_management_open_complete,cbs,
                       on_underlying_amqp_management_error,cbs);
    iVar3 = 0x19c;
    if (iVar1 == 0) {
      iVar3 = 0;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x18d;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_open_async",0x18c,1,"cbs instance already open");
    }
  }
  return iVar3;
}

Assistant:

int cbs_open_async(CBS_HANDLE cbs, ON_CBS_OPEN_COMPLETE on_cbs_open_complete, void* on_cbs_open_complete_context, ON_CBS_ERROR on_cbs_error, void* on_cbs_error_context)
{
    int result;

    /* Codes_SRS_CBS_01_042: [ `on_cbs_open_complete_context` and `on_cbs_error_context` shall be allowed to be NULL. ]*/
    if ((cbs == NULL) ||
        (on_cbs_open_complete == NULL) ||
        (on_cbs_error == NULL))
    {
        /* Codes_SRS_CBS_01_040: [ If any of the arguments `cbs`, `on_cbs_open_complete` or `on_cbs_error` is NULL, then `cbs_open_async` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: cbs = %p, on_cbs_open_complete = %p, on_cbs_error = %p",
            cbs, on_cbs_open_complete, on_cbs_error);
        result = MU_FAILURE;
    }
    else if (cbs->cbs_state != CBS_STATE_CLOSED)
    {
        /* Codes_SRS_CBS_01_043: [ `cbs_open_async` while already open or opening shall fail and return a non-zero value. ]*/
        LogError("cbs instance already open");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_CBS_01_078: [ The cbs instance shall be considered OPENING until the `on_amqp_management_open_complete` callback is called by the AMQP management instance indicating that the open has completed (succesfull or not). ]*/
        cbs->cbs_state = CBS_STATE_OPENING;
        cbs->on_cbs_open_complete = on_cbs_open_complete;
        cbs->on_cbs_open_complete_context = on_cbs_open_complete_context;
        cbs->on_cbs_error = on_cbs_error;
        cbs->on_cbs_error_context = on_cbs_error_context;

        /* Codes_SRS_CBS_01_039: [ `cbs_open_async` shall open the cbs communication by calling `amqp_management_open_async` on the AMQP management handle created in `cbs_create`. ]*/
        if (amqp_management_open_async(cbs->amqp_management, on_underlying_amqp_management_open_complete, cbs, on_underlying_amqp_management_error, cbs) != 0)
        {
            /* Codes_SRS_CBS_01_041: [ If `amqp_management_open_async` fails, shall fail and return a non-zero value. ]*/
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_CBS_01_077: [ On success, `cbs_open_async` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}